

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

void __thiscall
FOptionMenuItem::drawLabel(FOptionMenuItem *this,int indent,int y,EColorRange color,bool grayed)

{
  int iVar1;
  BYTE *string;
  undefined8 uVar2;
  
  string = (BYTE *)(this->mLabel).Chars;
  if (*string == '$') {
    string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
  }
  iVar1 = FFont::StringWidth(SmallFont,string);
  if (this->mCentered == false) {
    iVar1 = indent - iVar1 * CleanXfac_1;
  }
  else {
    iVar1 = ((screen->super_DSimpleCanvas).super_DCanvas.Width - iVar1 * CleanXfac_1) / 2;
  }
  uVar2 = 0x60300000;
  if (!grayed) {
    uVar2 = 0;
  }
  DCanvas::DrawText((DCanvas *)screen,SmallFont,color,iVar1,y,(char *)string,0x40001394,1,0x400013aa
                    ,uVar2,0);
  return;
}

Assistant:

void FOptionMenuItem::drawLabel(int indent, int y, EColorRange color, bool grayed)
{
	const char *label = mLabel.GetChars();
	if (*label == '$') label = GStrings(label+1);

	int overlay = grayed? MAKEARGB(96,48,0,0) : 0;

	int x;
	int w = SmallFont->StringWidth(label) * CleanXfac_1;
	if (!mCentered) x = indent - w;
	else x = (screen->GetWidth() - w) / 2;
	screen->DrawText (SmallFont, color, x, y, label, DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE);
}